

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BendTypeParser.cpp
# Opt level: O2

BendType * __thiscall
OpenMD::BendTypeParser::parseTypeAndPars
          (BendTypeParser *this,string *type,vector<double,_std::allocator<double>_> *pars)

{
  BendType *pBVar1;
  double *pdVar2;
  string line;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_70,(string *)type);
  for (pdVar2 = (pars->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pdVar2 != (pars->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish; pdVar2 = pdVar2 + 1) {
    std::__cxx11::string::append((char *)&local_70);
    std::__cxx11::to_string(&local_50,*pdVar2);
    std::__cxx11::string::append((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  pBVar1 = parseLine(this,&local_70,1.0);
  std::__cxx11::string::~string((string *)&local_70);
  return pBVar1;
}

Assistant:

BendType* BendTypeParser::parseTypeAndPars(const std::string& type,
                                             std::vector<RealType> pars) {
    std::string line(type);

    std::vector<RealType>::iterator it;
    for (it = pars.begin(); it != pars.end(); ++it) {
      line.append("\t");
      line.append(std::to_string(*it));
    }
    // Assume all overrides know about our functional forms:
    return parseLine(line, 1.0);
  }